

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_1ee5cf::setInputFrameBuffer
               (FrameBuffer *frameBuffer,int pixelType,Array2D<unsigned_int> *uData,
               Array2D<float> *fData,Array2D<half> *hData,int width,int height)

{
  ulong uVar1;
  uint *b;
  uint *extraout_RAX;
  uint *puVar2;
  float *b_00;
  float *extraout_RAX_00;
  float *pfVar3;
  half *b_01;
  char *name;
  undefined1 in_R10B;
  long lVar4;
  long lVar5;
  Slice local_68;
  
  if (pixelType == 2) {
    lVar4 = (long)width;
    lVar5 = height * lVar4;
    uVar1 = 0xffffffffffffffff;
    if (-1 < lVar5) {
      uVar1 = lVar5 * 2;
    }
    b_01 = (half *)operator_new__(uVar1);
    if (hData->_data != (half *)0x0) {
      operator_delete__(hData->_data);
    }
    hData->_sizeX = (long)height;
    hData->_sizeY = lVar4;
    hData->_data = b_01;
    Imf_2_5::Slice::Slice(&local_68,HALF,(char *)b_01,2,lVar4 * 2,1,1,0.0,(bool)in_R10B,false);
    name = "HALF";
  }
  else if (pixelType == 1) {
    lVar5 = (long)width;
    uVar1 = height * lVar5;
    b_00 = (float *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    pfVar3 = b_00;
    if (fData->_data != (float *)0x0) {
      operator_delete__(fData->_data);
      pfVar3 = extraout_RAX_00;
    }
    fData->_sizeX = (long)height;
    fData->_sizeY = lVar5;
    fData->_data = b_00;
    Imf_2_5::Slice::Slice
              (&local_68,FLOAT,(char *)b_00,4,lVar5 << 2,1,1,0.0,(bool)in_R10B,SUB81(pfVar3,0));
    name = "FLOAT";
  }
  else {
    if (pixelType != 0) {
      return;
    }
    lVar5 = (long)width;
    uVar1 = height * lVar5;
    b = (uint *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    puVar2 = b;
    if (uData->_data != (uint *)0x0) {
      operator_delete__(uData->_data);
      puVar2 = extraout_RAX;
    }
    uData->_sizeX = (long)height;
    uData->_sizeY = lVar5;
    uData->_data = b;
    Imf_2_5::Slice::Slice
              (&local_68,UINT,(char *)b,4,lVar5 << 2,1,1,0.0,(bool)in_R10B,SUB81(puVar2,0));
    name = "UINT";
  }
  Imf_2_5::FrameBuffer::insert(frameBuffer,name,&local_68);
  return;
}

Assistant:

void setInputFrameBuffer(FrameBuffer& frameBuffer, int pixelType,
                         Array2D<unsigned int>& uData, Array2D<float>& fData,
                         Array2D<half>& hData, int width, int height)
{
    switch (pixelType)
    {
        case 0:
            uData.resizeErase(height, width);
            frameBuffer.insert ("UINT",
                                Slice (IMF::UINT,
                                (char *) (&uData[0][0]),
                                sizeof (uData[0][0]) * 1,
                                sizeof (uData[0][0]) * width,
                                1, 1,
                                0));
            break;
        case 1:
            fData.resizeErase(height, width);
            frameBuffer.insert ("FLOAT",
                                Slice (IMF::FLOAT,
                                (char *) (&fData[0][0]),
                                sizeof (fData[0][0]) * 1,
                                sizeof (fData[0][0]) * width,
                                1, 1,
                                0));
            break;
        case 2:
            hData.resizeErase(height, width);
            frameBuffer.insert ("HALF",
                                Slice (IMF::HALF,
                                (char *) (&hData[0][0]),
                                sizeof (hData[0][0]) * 1,
                                sizeof (hData[0][0]) * width,
                                1, 1,
                                0));
            break;
    }
}